

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O0

List __thiscall xt::list::cons(list *this,Object *o)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  List LVar1;
  Object local_48;
  shared_ptr<xt::_List> local_28;
  Object *local_18;
  Object *o_local;
  
  local_18 = o;
  o_local = (Object *)this;
  std::shared_ptr<xt::_List>::shared_ptr(&local_28,(shared_ptr<xt::_List> *)EMPTY);
  Object::Object(&local_48,o);
  cons(this,&local_28,&local_48);
  Object::~Object(&local_48);
  std::shared_ptr<xt::_List>::~shared_ptr(&local_28);
  LVar1.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  LVar1.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (List)LVar1.super___shared_ptr<xt::_List,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

List cons(Object o) {
	return cons(EMPTY, o);
}